

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O2

void google::protobuf::compiler::cpp::anon_unknown_7::MaySetAnnotationVariable
               (Options *options,StringPiece annotation_name,StringPiece substitute_template_prefix,
               StringPiece prepared_template,int field_index,StringPiece access_type,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  size_type sVar1;
  mapped_type *this;
  AlphaNum *pAVar2;
  string sStack_368;
  string local_348;
  StringPiece annotation_name_local;
  string local_318;
  string local_2f8;
  SubstituteArg local_2c8;
  AlphaNum local_298;
  char *local_268;
  undefined8 local_260;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  annotation_name_local.length_ = annotation_name.length_;
  annotation_name_local.ptr_ = annotation_name.ptr_;
  pAVar2 = (AlphaNum *)substitute_template_prefix.length_;
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_2f8,&annotation_name_local);
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&(options->field_listener_options).forbidden_field_listener_events,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  if (sVar1 == 0) {
    local_58.piece_data_ = prepared_template.ptr_;
    local_58.piece_size_ = prepared_template.length_;
    local_88.piece_data_ = ");\n";
    local_88.piece_size_ = 3;
    local_2f8._M_dataplus._M_p = substitute_template_prefix.ptr_;
    local_2f8._M_string_length = (size_type)substitute_template_prefix.length_;
    StrCat_abi_cxx11_(&local_348,(protobuf *)&local_2f8,&local_58,&local_88,pAVar2);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c8,field_index);
    local_e8.text_ = (char *)0x0;
    local_e8.size_ = -1;
    local_118.text_ = (char *)0x0;
    local_118.size_ = -1;
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_178.text_ = (char *)0x0;
    local_178.size_ = -1;
    local_1a8.text_ = (char *)0x0;
    local_1a8.size_ = -1;
    local_1d8.text_ = (char *)0x0;
    pAVar2 = &local_b8;
    local_1d8.size_ = -1;
    local_208.text_ = (char *)0x0;
    local_b8.piece_data_ = access_type.ptr_;
    local_208.size_ = -1;
    local_238.text_ = (char *)0x0;
    local_b8.piece_size_._0_4_ = (undefined4)access_type.length_;
    local_238.size_ = -1;
    strings::Substitute(&local_318,&local_348,&local_2c8,(SubstituteArg *)pAVar2,&local_e8,
                        &local_118,&local_148,&local_178,&local_1a8,&local_1d8,&local_208,&local_238
                       );
    local_268 = "annotate_";
    local_260 = 9;
    local_298.piece_data_ = annotation_name_local.ptr_;
    local_298.piece_size_ = annotation_name_local.length_;
    StrCat_abi_cxx11_(&sStack_368,(protobuf *)&local_268,&local_298,pAVar2);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&sStack_368);
    std::__cxx11::string::operator=((string *)this,(string *)&local_318);
    std::__cxx11::string::~string((string *)&sStack_368);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_348);
  }
  return;
}

Assistant:

void MaySetAnnotationVariable(const Options& options,
                              StringPiece annotation_name,
                              StringPiece substitute_template_prefix,
                              StringPiece prepared_template,
                              int field_index, StringPiece access_type,
                              std::map<std::string, std::string>* variables) {
  if (options.field_listener_options.forbidden_field_listener_events.count(
          std::string(annotation_name)))
    return;
  (*variables)[StrCat("annotate_", annotation_name)] = strings::Substitute(
      StrCat(substitute_template_prefix, prepared_template, ");\n"),
      field_index, access_type);
}